

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
            *this,RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>
                  *other)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  Index IVar4;
  Pos_index PVar5;
  Column_settings *pCVar6;
  Column_settings *pCVar7;
  Field_operators *pFVar8;
  pointer puVar9;
  
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,other,other);
  puVar9 = (other->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (other->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar9;
  (this->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (other->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (other->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (other->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (other->reducedMatrixR_).super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar2 = (other->reducedMatrixR_).super_Matrix_dimension_option.maxDim_;
  (other->reducedMatrixR_).super_Matrix_dimension_option.maxDim_ = -1;
  (this->reducedMatrixR_).super_Matrix_dimension_option.maxDim_ = iVar2;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&(this->reducedMatrixR_).
                   super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
               ,&(other->reducedMatrixR_).
                 super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
              );
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->reducedMatrixR_).
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
                .rowToIndex_._M_h,
               &(other->reducedMatrixR_).
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
                .rowToIndex_);
  bVar1 = (other->reducedMatrixR_).
          super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
          .rowSwapped_;
  (other->reducedMatrixR_).
  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
  .rowSwapped_ = false;
  (this->reducedMatrixR_).
  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
  .rowSwapped_ = bVar1;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->reducedMatrixR_).matrix_._M_h,&(other->reducedMatrixR_).matrix_);
  IVar3 = (other->reducedMatrixR_).nextInsertIndex_;
  (other->reducedMatrixR_).nextInsertIndex_ = 0;
  (this->reducedMatrixR_).nextInsertIndex_ = IVar3;
  pCVar6 = (other->reducedMatrixR_).colSettings_;
  (other->reducedMatrixR_).colSettings_ = (Column_settings *)0x0;
  (this->reducedMatrixR_).colSettings_ = pCVar6;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&this->mirrorMatrixU_,&other->mirrorMatrixU_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->mirrorMatrixU_).
                super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
                .rowToIndex_._M_h,
               &(other->mirrorMatrixU_).
                super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
                .rowToIndex_);
  bVar1 = (other->mirrorMatrixU_).
          super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
          .rowSwapped_;
  (other->mirrorMatrixU_).
  super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
  .rowSwapped_ = false;
  (this->mirrorMatrixU_).
  super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_false>_>_>_>
  .rowSwapped_ = bVar1;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->mirrorMatrixU_).matrix_._M_h,&(other->mirrorMatrixU_).matrix_);
  IVar4 = (other->mirrorMatrixU_).nextInsertIndex_;
  (other->mirrorMatrixU_).nextInsertIndex_ = 0;
  (this->mirrorMatrixU_).nextInsertIndex_ = IVar4;
  pCVar7 = (other->mirrorMatrixU_).colSettings_;
  (other->mirrorMatrixU_).colSettings_ = (Column_settings *)0x0;
  (this->mirrorMatrixU_).colSettings_ = pCVar7;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->pivotToColumnIndex_)._M_h,&other->pivotToColumnIndex_);
  PVar5 = other->nextEventIndex_;
  other->nextEventIndex_ = 0;
  this->nextEventIndex_ = PVar5;
  pFVar8 = other->operators_;
  other->operators_ = (Field_operators *)0x0;
  this->operators_ = pFVar8;
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(RU_matrix&& other) noexcept
    : Pair_opt(std::move(static_cast<Pair_opt&>(other))),
      Swap_opt(std::move(static_cast<Swap_opt&>(other))),
      Rep_opt(std::move(static_cast<Rep_opt&>(other))),
      reducedMatrixR_(std::move(other.reducedMatrixR_)),
      mirrorMatrixU_(std::move(other.mirrorMatrixU_)),
      pivotToColumnIndex_(std::move(other.pivotToColumnIndex_)),
      nextEventIndex_(std::exchange(other.nextEventIndex_, 0)),
      operators_(std::exchange(other.operators_, nullptr))
{}